

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceVertexParameterizationQuantity::fillColorBuffers
          (SurfaceVertexParameterizationQuantity *this,ShaderProgram *p)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  vec<2,_float,_(glm::qualifier)0> *pvVar5;
  ulong uVar6;
  ulong uVar7;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coordVal;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_88;
  ShaderProgram *local_68;
  ulong local_60;
  long *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_88.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  local_88.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  lVar1 = *(long *)&(this->super_SurfaceParameterizationQuantity).field_0x8;
  local_68 = p;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::reserve(&local_88,*(long *)(lVar1 + 0x2e8) - *(long *)(lVar1 + 0x2e0) >> 3);
  lVar1 = *(long *)&(this->super_SurfaceParameterizationQuantity).field_0x8;
  lVar4 = *(long *)(lVar1 + 0x2e0);
  if (*(long *)(lVar1 + 0x2e8) != lVar4) {
    uVar7 = 0;
    do {
      plVar2 = *(long **)(lVar4 + uVar7 * 0x18);
      uVar6 = *(long *)(lVar4 + 8 + uVar7 * 0x18) - (long)plVar2 >> 3;
      local_60 = uVar7;
      if (2 < uVar6) {
        local_58 = (long *)(lVar4 + uVar7 * 0x18);
        lVar1 = *plVar2;
        uVar7 = 2;
        do {
          lVar4 = *(long *)(*local_58 + -8 + uVar7 * 8);
          lVar3 = *(long *)(*local_58 + uVar7 * 8);
          pvVar5 = (this->coords).
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar1;
          if (local_88.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                        *)&local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pvVar5);
          }
          else {
            *local_88.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = *pvVar5;
            local_88.
            super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pvVar5 = (this->coords).
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar4;
          if (local_88.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                        *)&local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pvVar5);
          }
          else {
            *local_88.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = *pvVar5;
            local_88.
            super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pvVar5 = (this->coords).
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar3;
          if (local_88.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                        *)&local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pvVar5);
          }
          else {
            *local_88.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish = *pvVar5;
            local_88.
            super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      uVar7 = local_60 + 1;
      lVar1 = *(long *)&(this->super_SurfaceParameterizationQuantity).field_0x8;
      lVar4 = *(long *)(lVar1 + 0x2e0);
    } while (uVar7 < (ulong)((*(long *)(lVar1 + 0x2e8) - lVar4 >> 3) * -0x5555555555555555));
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a_value2","");
  (*local_68->_vptr_ShaderProgram[0xf])(local_68,local_50,&local_88,0,0,0xffffffff);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_88.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SurfaceVertexParameterizationQuantity::fillColorBuffers(render::ShaderProgram& p) {
  std::vector<glm::vec2> coordVal;
  coordVal.reserve(3 * parent.nFacesTriangulation());

  for (size_t iF = 0; iF < parent.nFaces(); iF++) {
    auto& face = parent.faces[iF];
    size_t D = face.size();

    // implicitly triangulate from root
    size_t vRoot = face[0];
    for (size_t j = 1; (j + 1) < D; j++) {
      size_t vB = face[j];
      size_t vC = face[(j + 1) % D];

      coordVal.push_back(coords[vRoot]);
      coordVal.push_back(coords[vB]);
      coordVal.push_back(coords[vC]);
    }
  }

  // Store data in buffers
  p.setAttribute("a_value2", coordVal);
}